

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::reallocateTo
          (SmallVectorBase<slang::Diagnostic> *this,size_type newCapacity)

{
  Diagnostic *__result;
  move_iterator<slang::Diagnostic_*> __last;
  
  __result = (Diagnostic *)operator_new(newCapacity * 0x70);
  __last._M_current = this->data_ + this->len;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (this->data_,__last,__result);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }